

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  _Bool _Var2;
  undefined7 extraout_var;
  sysbvm_tuple_t sVar3;
  undefined8 uVar4;
  anon_struct_40_5_c7ef10b2 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  puStack_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  _Var2 = sysbvm_analysisEnvironment_lookSymbolRecursively
                    (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x28),&local_78);
  if (_Var2) {
    _Var2 = sysbvm_symbolBinding_isValue(context,local_78);
    sVar3 = CONCAT71(extraout_var,_Var2);
    if (_Var2) {
      lVar1 = *(long *)(local_78 + 0x40);
      if (lVar1 != 0x1f) {
        sysbvm_stackFrame_popRecord(&local_48);
        sysbvm_stackFrame_popRecord(&local_60);
        if (((local_78 & 0xf) == 0 && local_78 != 0) && (0x57 < *(uint *)(local_78 + 0xc))) {
          sVar3 = *(sysbvm_tuple_t *)(local_78 + 0x38);
        }
        else {
          sVar3 = 0;
        }
        sVar3 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(*arguments + 0x10),sVar3);
      }
      if (lVar1 != 0x1f) {
        return sVar3;
      }
    }
    else {
      _Var2 = sysbvm_symbolBinding_isMacroValue(context,local_78);
      if (_Var2) {
        if (((local_78 & 0xf) == 0 && local_78 != 0) && (0x2f < *(uint *)(local_78 + 0xc))) {
          sStack_80 = *(sysbvm_tuple_t *)(local_78 + 0x38);
        }
        else {
          sStack_80 = 0;
        }
        sysbvm_stackFrame_popRecord(&local_48);
        sysbvm_stackFrame_popRecord(&local_60);
        sVar3 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                          (context,sStack_80,arguments[1]);
        return sVar3;
      }
    }
  }
  else {
    sStack_70 = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(*arguments + 0x28));
    sVar3 = sysbvm_string_createWithCString(context,"Failed to find symbol binding for ");
    local_68 = sysbvm_string_concat(context,sVar3,sStack_70);
    sysbvm_errorWithMessageTuple(local_68);
  }
  local_88 = sysbvm_context_shallowCopy(context,*arguments);
  *(sysbvm_tuple_t *)(local_88 + 0x30) = local_78;
  if ((local_78 & 0xf) == 0 && local_78 != 0) {
    uVar4 = *(undefined8 *)(local_78 + 0x30);
  }
  else {
    uVar4 = 0;
  }
  *(undefined8 *)(local_88 + 0x20) = uVar4;
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x18) = sVar3;
  sysbvm_stackFrame_popRecord(&local_48);
  sysbvm_stackFrame_popRecord(&local_60);
  return local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;

    struct {
        sysbvm_astIdentifierReferenceNode_t *analyzedNode;
        sysbvm_tuple_t expansionNode;
        sysbvm_tuple_t binding;
        sysbvm_tuple_t symbolString;
        sysbvm_tuple_t errorMessage;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    // Attempt to replace the symbol with its binding, if it exists.
    if(sysbvm_analysisEnvironment_lookSymbolRecursively(context, *environment, (*referenceNode)->value, &gcFrame.binding))
    {
        if(sysbvm_symbolBinding_isValue(context, gcFrame.binding))
        {
            // Preserve the references into mutable bindings.
            bool isMutable = sysbvm_tuple_boolean_decode(((sysbvm_symbolValueBinding_t*)gcFrame.binding)->isMutable);
            if(!isMutable)
            {
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                return sysbvm_astLiteralNode_create(context, (*referenceNode)->super.sourcePosition, sysbvm_symbolValueBinding_getValue(gcFrame.binding));
            }
        }
        else if(sysbvm_symbolBinding_isMacroValue(context, gcFrame.binding))
        {
            gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionNode, *environment);
        }
    }
    else
    {
        gcFrame.symbolString = sysbvm_tuple_printString(context, (*referenceNode)->value);
        gcFrame.errorMessage = sysbvm_string_concat(context, sysbvm_string_createWithCString(context, "Failed to find symbol binding for "), gcFrame.symbolString);
        sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
    }

    gcFrame.analyzedNode = (sysbvm_astIdentifierReferenceNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*referenceNode);
    gcFrame.analyzedNode->binding = gcFrame.binding;
    gcFrame.analyzedNode->super.analyzedType = sysbvm_symbolBinding_getType(gcFrame.binding);
    gcFrame.analyzedNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedNode;
}